

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineTimestampTests.cpp
# Opt level: O2

TestInstance * __thiscall
vkt::pipeline::anon_unknown_0::AdvGraphicsTest::createInstance
          (AdvGraphicsTest *this,Context *context)

{
  undefined1 *this_00;
  bool inRenderPass;
  VkAllocationCallbacks *pVVar1;
  BasicGraphicsTestInstance *this_01;
  VkPhysicalDeviceFeatures *__src;
  DeviceInterface *vkd;
  VkDevice device;
  char *entry_name;
  RefBase<vk::Handle<(vk::HandleType)18>_> local_a8;
  deUint64 local_88;
  DeviceInterface *pDStack_80;
  VkDevice local_78;
  VkAllocationCallbacks *pVStack_70;
  _Vector_base<vk::VkPipelineStageFlagBits,_std::allocator<vk::VkPipelineStageFlagBits>_> local_68;
  _Vector_base<vk::VkPipelineStageFlagBits,_std::allocator<vk::VkPipelineStageFlagBits>_> local_50;
  Vector<unsigned_int,_2> local_38;
  
  this_01 = (BasicGraphicsTestInstance *)operator_new(0x5e8);
  std::vector<vk::VkPipelineStageFlagBits,_std::allocator<vk::VkPipelineStageFlagBits>_>::vector
            ((vector<vk::VkPipelineStageFlagBits,_std::allocator<vk::VkPipelineStageFlagBits>_> *)
             &local_68,&(this->super_BasicGraphicsTest).super_TimestampTest.m_stages);
  inRenderPass = (this->super_BasicGraphicsTest).super_TimestampTest.m_inRenderPass;
  std::vector<vk::VkPipelineStageFlagBits,_std::allocator<vk::VkPipelineStageFlagBits>_>::vector
            ((vector<vk::VkPipelineStageFlagBits,_std::allocator<vk::VkPipelineStageFlagBits>_> *)
             &local_50,
             (vector<vk::VkPipelineStageFlagBits,_std::allocator<vk::VkPipelineStageFlagBits>_> *)
             &local_68);
  entry_name = (char *)(ulong)inRenderPass;
  BasicGraphicsTestInstance::BasicGraphicsTestInstance
            (this_01,context,(StageFlagVector *)&local_50,inRenderPass);
  std::_Vector_base<vk::VkPipelineStageFlagBits,_std::allocator<vk::VkPipelineStageFlagBits>_>::
  ~_Vector_base(&local_50);
  (this_01->super_TimestampTestInstance).super_TestInstance._vptr_TestInstance =
       (_func_int **)&PTR__AdvGraphicsTestInstance_00bcc7a8;
  this_01[1].m_colorImage.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  this_00 = &this_01[1].m_colorImageAlloc.
             super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.field_0x8;
  *(undefined8 *)
   &this_01[1].m_colorImageAlloc.
    super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.field_0x8 = 0;
  this_01[1].m_depthImage.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal = 0
  ;
  this_01[1].m_depthImage.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_deviceIface
       = (DeviceInterface *)0x0;
  this_01[1].m_depthImage.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_device =
       (VkDevice)0x0;
  __src = Context::getDeviceFeatures
                    ((this_01->super_TimestampTestInstance).super_TestInstance.m_context);
  memcpy(this_01 + 1,__src,0xdc);
  (*(this_01->super_TimestampTestInstance).super_TestInstance._vptr_TestInstance[8])(this_01);
  if (*(int *)&this_01[1].super_TimestampTestInstance.m_stages.
               super__Vector_base<vk::VkPipelineStageFlagBits,_std::allocator<vk::VkPipelineStageFlagBits>_>
               ._M_impl.super__Vector_impl_data._M_start == 1) {
    SimpleGraphicsPipelineBuilder::bindShaderStage
              (&this_01->m_pipelineBuilder,VK_SHADER_STAGE_GEOMETRY_BIT,"dummy_geo",entry_name);
  }
  if (*(int *)((long)&this_01[1].super_TimestampTestInstance.m_stages.
                      super__Vector_base<vk::VkPipelineStageFlagBits,_std::allocator<vk::VkPipelineStageFlagBits>_>
                      ._M_impl.super__Vector_impl_data._M_start + 4) == 1) {
    SimpleGraphicsPipelineBuilder::bindShaderStage
              (&this_01->m_pipelineBuilder,VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT,"basic_tcs",
               entry_name);
    SimpleGraphicsPipelineBuilder::bindShaderStage
              (&this_01->m_pipelineBuilder,VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT,"basic_tes",
               entry_name);
    (this_01->m_pipelineBuilder).m_patchControlPoints = 3;
  }
  tcu::Vector<unsigned_int,_2>::Vector(&local_38,&this_01->m_renderSize);
  SimpleGraphicsPipelineBuilder::buildPipeline
            ((Move<vk::Handle<(vk::HandleType)18>_> *)&local_a8,&this_01->m_pipelineBuilder,
             &local_38,
             (VkRenderPass)
             (this_01->m_renderPass).super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.
             m_internal);
  local_78 = local_a8.m_data.deleter.m_device;
  pVStack_70 = local_a8.m_data.deleter.m_allocator;
  local_88 = local_a8.m_data.object.m_internal;
  pDStack_80 = local_a8.m_data.deleter.m_deviceIface;
  local_a8.m_data.object.m_internal = 0;
  local_a8.m_data.deleter.m_deviceIface = (DeviceInterface *)0x0;
  local_a8.m_data.deleter.m_device = (VkDevice)0x0;
  local_a8.m_data.deleter.m_allocator = (VkAllocationCallbacks *)0x0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)18>_>::reset
            (&(this_01->m_graphicsPipelines).super_RefBase<vk::Handle<(vk::HandleType)18>_>);
  (this_01->m_graphicsPipelines).super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.
  m_device = local_78;
  (this_01->m_graphicsPipelines).super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.
  m_allocator = pVStack_70;
  (this_01->m_graphicsPipelines).super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.
  m_internal = local_88;
  (this_01->m_graphicsPipelines).super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.
  m_deviceIface = pDStack_80;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)18>_>::~RefBase(&local_a8);
  vkd = Context::getDeviceInterface
                  ((this_01->super_TimestampTestInstance).super_TestInstance.m_context);
  device = Context::getDevice((this_01->super_TimestampTestInstance).super_TestInstance.m_context);
  *(uint *)((long)&this_01[1].m_colorImage.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.
                   deleter.m_device + 4) =
       (*(int *)((long)&this_01[1].super_TimestampTestInstance.m_stages.
                        super__Vector_base<vk::VkPipelineStageFlagBits,_std::allocator<vk::VkPipelineStageFlagBits>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage + 4) == 1) + 1;
  TimestampTestInstance::createBufferAndBindMemory
            ((Move<vk::Handle<(vk::HandleType)8>_> *)&local_a8,(TimestampTestInstance *)this_01,0x20
             ,0x100,(MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)
                    &this_01[1].m_colorImage.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.
                     deleter.m_allocator);
  local_78 = local_a8.m_data.deleter.m_device;
  pVStack_70 = local_a8.m_data.deleter.m_allocator;
  local_88 = local_a8.m_data.object.m_internal;
  pDStack_80 = local_a8.m_data.deleter.m_deviceIface;
  local_a8.m_data.object.m_internal = 0;
  local_a8.m_data.deleter.m_deviceIface = (DeviceInterface *)0x0;
  local_a8.m_data.deleter.m_device = (VkDevice)0x0;
  local_a8.m_data.deleter.m_allocator = (VkAllocationCallbacks *)0x0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::reset
            ((RefBase<vk::Handle<(vk::HandleType)8>_> *)this_00);
  this_01[1].m_depthImage.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_deviceIface
       = (DeviceInterface *)local_78;
  this_01[1].m_depthImage.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_device =
       (VkDevice)pVStack_70;
  *(deUint64 *)this_00 = local_88;
  this_01[1].m_depthImage.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal =
       (deUint64)pDStack_80;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)8>_> *)&local_a8);
  memcpy((this_01[1].m_colorImage.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.
         m_allocator)->pfnFree,&DAT_00951c40,
         (ulong)*(uint *)((long)&this_01[1].m_colorImage.
                                 super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.
                                 m_device + 4) << 4);
  pVVar1 = this_01[1].m_colorImage.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.
           m_allocator;
  ::vk::flushMappedMemoryRange
            (vkd,device,(VkDeviceMemory)pVVar1->pfnAllocation,(VkDeviceSize)pVVar1->pfnReallocation,
             0x20);
  std::_Vector_base<vk::VkPipelineStageFlagBits,_std::allocator<vk::VkPipelineStageFlagBits>_>::
  ~_Vector_base(&local_68);
  return (TestInstance *)this_01;
}

Assistant:

TestInstance* AdvGraphicsTest::createInstance(Context& context) const
{
	return new AdvGraphicsTestInstance(context,m_stages,m_inRenderPass);
}